

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

uint64_t sx_hash_xxh64_digest(sx_hash_xxh64_t *state)

{
  XXH64_hash_t XVar1;
  XXH64_state_t *xstate;
  sx_hash_xxh64_t *state_local;
  
  XVar1 = XXH64_digest((XXH64_state_t *)state);
  return XVar1;
}

Assistant:

uint64_t sx_hash_xxh64_digest(sx_hash_xxh64_t* state)
{
    XXH64_state_t* xstate = (XXH64_state_t*)state;
    return XXH64_digest(xstate);
}